

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jcapimin.c
# Opt level: O2

void jpeg_CreateCompress(j_compress_ptr cinfo,int version,size_t structsize)

{
  UINT8 *pUVar1;
  jpeg_error_mgr *pjVar2;
  void *pvVar3;
  long lVar4;
  
  cinfo->mem = (jpeg_memory_mgr *)0x0;
  if (version != 0x50) {
    *(undefined8 *)&cinfo->err->msg_code = 0x500000000d;
    (cinfo->err->msg_parm).i[1] = version;
    (*cinfo->err->error_exit)((j_common_ptr)cinfo);
  }
  if (structsize != 0x248) {
    *(undefined8 *)&cinfo->err->msg_code = 0x24800000016;
    (cinfo->err->msg_parm).i[1] = (int)structsize;
    (*cinfo->err->error_exit)((j_common_ptr)cinfo);
  }
  pjVar2 = cinfo->err;
  pvVar3 = cinfo->client_data;
  memset(&cinfo->mem,0,0x240);
  cinfo->err = pjVar2;
  cinfo->client_data = pvVar3;
  jinit_memory_mgr((j_common_ptr)cinfo);
  cinfo->progress = (jpeg_progress_mgr *)0x0;
  cinfo->dest = (jpeg_destination_mgr *)0x0;
  cinfo->comp_info = (jpeg_component_info *)0x0;
  for (lVar4 = -0x10; lVar4 != 0; lVar4 = lVar4 + 4) {
    *(undefined8 *)((long)cinfo->q_scale_factor + lVar4 * 2) = 0;
    *(undefined4 *)((long)cinfo->dc_huff_tbl_ptrs + lVar4) = 100;
  }
  for (lVar4 = -0x20; lVar4 != 0; lVar4 = lVar4 + 8) {
    *(undefined8 *)((long)cinfo->ac_huff_tbl_ptrs + lVar4) = 0;
    pUVar1 = cinfo->arith_dc_L + lVar4;
    pUVar1[0] = '\0';
    pUVar1[1] = '\0';
    pUVar1[2] = '\0';
    pUVar1[3] = '\0';
    pUVar1[4] = '\0';
    pUVar1[5] = '\0';
    pUVar1[6] = '\0';
    pUVar1[7] = '\0';
  }
  cinfo->block_size = 8;
  cinfo->natural_order = jpeg_natural_order;
  cinfo->lim_Se = 0x3f;
  cinfo->script_space = (jpeg_scan_info *)0x0;
  cinfo->input_gamma = 1.0;
  cinfo->global_state = 100;
  return;
}

Assistant:

GLOBAL(void)
jpeg_CreateCompress (j_compress_ptr cinfo, int version, size_t structsize)
{
  int i;

  /* Guard against version mismatches between library and caller. */
  cinfo->mem = NULL;		/* so jpeg_destroy knows mem mgr not called */
  if (version != JPEG_LIB_VERSION)
    ERREXIT2(cinfo, JERR_BAD_LIB_VERSION, JPEG_LIB_VERSION, version);
  if (structsize != SIZEOF(struct jpeg_compress_struct))
    ERREXIT2(cinfo, JERR_BAD_STRUCT_SIZE, 
	     (int) SIZEOF(struct jpeg_compress_struct), (int) structsize);

  /* For debugging purposes, we zero the whole master structure.
   * But the application has already set the err pointer, and may have set
   * client_data, so we have to save and restore those fields.
   * Note: if application hasn't set client_data, tools like Purify may
   * complain here.
   */
  {
    struct jpeg_error_mgr * err = cinfo->err;
    void * client_data = cinfo->client_data; /* ignore Purify complaint here */
    MEMZERO(cinfo, SIZEOF(struct jpeg_compress_struct));
    cinfo->err = err;
    cinfo->client_data = client_data;
  }
  cinfo->is_decompressor = FALSE;

  /* Initialize a memory manager instance for this object */
  jinit_memory_mgr((j_common_ptr) cinfo);

  /* Zero out pointers to permanent structures. */
  cinfo->progress = NULL;
  cinfo->dest = NULL;

  cinfo->comp_info = NULL;

  for (i = 0; i < NUM_QUANT_TBLS; i++) {
    cinfo->quant_tbl_ptrs[i] = NULL;
    cinfo->q_scale_factor[i] = 100;
  }

  for (i = 0; i < NUM_HUFF_TBLS; i++) {
    cinfo->dc_huff_tbl_ptrs[i] = NULL;
    cinfo->ac_huff_tbl_ptrs[i] = NULL;
  }

  /* Must do it here for emit_dqt in case jpeg_write_tables is used */
  cinfo->block_size = DCTSIZE;
  cinfo->natural_order = jpeg_natural_order;
  cinfo->lim_Se = DCTSIZE2-1;

  cinfo->script_space = NULL;

  cinfo->input_gamma = 1.0;	/* in case application forgets */

  /* OK, I'm ready */
  cinfo->global_state = CSTATE_START;
}